

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

uint Extra_TruthSemiCanonicize(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm,short *pStore)

{
  ushort *puVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  int Counter;
  int iVar8;
  ulong uVar9;
  uint *pIn;
  uint local_4c;
  
  uVar7 = (ulong)(uint)(1 << ((byte)nVars - 5 & 0x1f));
  if (nVars < 6) {
    uVar7 = 1;
  }
  iVar8 = 0;
  for (uVar9 = uVar7; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
    iVar5 = Extra_WordCountOnes(pInOut[uVar9 - 1]);
    iVar8 = iVar8 + iVar5;
  }
  iVar5 = (int)uVar7 * 0x10;
  if ((iVar8 != iVar5 && SBORROW4(iVar8,iVar5) == iVar8 + (int)uVar7 * -0x10 < 0) ||
     ((local_4c = 0, iVar8 == iVar5 && ((*pInOut & 1) != 0)))) {
    for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      pInOut[uVar7 - 1] = ~pInOut[uVar7 - 1];
    }
    local_4c = 1 << ((byte)nVars & 0x1f);
  }
  Extra_TruthCountOnesInCofs(pInOut,nVars,pStore);
  uVar9 = 0;
  uVar7 = 0;
  if (0 < nVars) {
    uVar7 = (ulong)(uint)nVars;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    sVar2 = pStore[uVar9 * 2];
    if (pStore[uVar9 * 2 + 1] < sVar2) {
      local_4c = local_4c | 1 << ((uint)uVar9 & 0x1f);
      pStore[uVar9 * 2] = pStore[uVar9 * 2 + 1];
      pStore[uVar9 * 2 + 1] = sVar2;
      Extra_TruthChangePhase(pInOut,nVars,(uint)uVar9);
    }
  }
  iVar8 = 1;
  if (1 < nVars) {
    iVar8 = nVars;
  }
  bVar4 = true;
  bVar6 = false;
  uVar7 = 0;
  do {
    while (pIn = pInOut, uVar9 = uVar7, pInOut = pIn, iVar8 - 1 != uVar9) {
      uVar7 = uVar9 + 1;
      if (pStore[uVar9 * 2 + 2] < pStore[uVar9 * 2]) {
        bVar6 = (bool)(bVar6 ^ 1);
        puVar1 = (ushort *)(pCanonPerm + uVar9);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        *(ulong *)(pStore + uVar7 * 2 + -2) =
             CONCAT44((int)*(undefined8 *)(pStore + uVar7 * 2 + -2),
                      (int)((ulong)*(undefined8 *)(pStore + uVar7 * 2 + -2) >> 0x20));
        Extra_TruthSwapAdjacentVars(pAux,pIn,nVars,(int)uVar7 + -1);
        bVar4 = false;
        pInOut = pAux;
        pAux = pIn;
      }
    }
    bVar3 = !bVar4;
    uVar7 = 0;
    bVar4 = true;
  } while (bVar3);
  if (bVar6) {
    Extra_TruthCopy(pAux,pIn,nVars);
  }
  return local_4c;
}

Assistant:

unsigned Extra_TruthSemiCanonicize( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm, short * pStore )
{
    unsigned * pIn = pInOut, * pOut = pAux, * pTemp;
    int nWords = Extra_TruthWordNum( nVars );
    int i, Temp, fChange, Counter, nOnes;//, k, j, w, Limit;
    unsigned uCanonPhase;

    // canonicize output
    uCanonPhase = 0;
    nOnes = Extra_TruthCountOnes(pIn, nVars);
    if ( (nOnes > nWords * 16) || ((nOnes == nWords * 16) && (pIn[0] & 1)) )
    {
        uCanonPhase |= (1 << nVars);
        Extra_TruthNot( pIn, pIn, nVars );
    }

    // collect the minterm counts
    Extra_TruthCountOnesInCofs( pIn, nVars, pStore );

    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        Extra_TruthChangePhase( pIn, nVars, i );
    }

//    Extra_PrintHexadecimal( stdout, pIn, nVars );
//    printf( "\n" );

    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

/*
    Extra_PrintBinary( stdout, &uCanonPhase, nVars+1 ); printf( " : " );
    for ( i = 0; i < nVars; i++ )
        printf( "%d=%d/%d  ", pCanonPerm[i], pStore[2*i], pStore[2*i+1] );
    printf( "  C = %d\n", Counter );
    Extra_PrintHexadecimal( stdout, pIn, nVars );
    printf( "\n" );
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        if ( pStore[2*i] != pStore[2*i+1] )
            continue;
        if ( Extra_TruthVarsSymm( pIn, nVars, i, i+1 ) )
            continue;
        if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, i+1 ) )
            Extra_TruthChangePhase( pIn, nVars, i+1 );
    }
*/

/*
    // process symmetric variable groups
    uSymms = 0;
    for ( i = 0; i < nVars-1; i++ )
    {
        if ( pStore[2*i] != pStore[2*(i+1)] ) // i and i+1 cannot be symmetric
            continue;
        // i and i+1 can be symmetric
        // find the end of this group
        for ( k = i+1; k < nVars; k++ )
            if ( pStore[2*i] != pStore[2*k] ) 
                break;
        Limit = k;
        assert( i < Limit-1 );
        // go through the variables in this group
        for ( j = i + 1; j < Limit; j++ )
        {
            // check symmetry
            if ( Extra_TruthVarsSymm( pIn, nVars, i, j ) )
            {
                uSymms |= (1 << j);
                continue;
            }
            // they are phase-unknown
            if ( pStore[2*i] == pStore[2*i+1] ) 
            {
                if ( Extra_TruthVarsAntiSymm( pIn, nVars, i, j ) )
                {
                    Extra_TruthChangePhase( pIn, nVars, j );
                    uCanonPhase ^= (1 << j);
                    uSymms |= (1 << j);
                    continue;
                }
            }

            // they are not symmetric - move j as far as it goes in the group
            for ( k = j; k < Limit-1; k++ )
            {
                Counter++;

                Temp = pCanonPerm[k];
                pCanonPerm[k] = pCanonPerm[k+1];
                pCanonPerm[k+1] = Temp;

                assert( pStore[2*k] == pStore[2*(k+1)] );
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVars, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
            }
            Limit--;
            j--;
        }
        i = Limit - 1;
    }
*/

    // swap if it was moved an even number of times
    if ( Counter & 1 )
        Extra_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}